

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O0

wchar_t rd_dungeon_aux(chunk **c)

{
  chunk *c_00;
  int iVar1;
  char *pcVar2;
  loc_conflict grid;
  connector *pcVar3;
  bitflag *pbVar4;
  connector *current;
  char local_98 [8];
  char name [100];
  ushort local_2c;
  ushort local_2a;
  uint16_t tmp16u;
  uint8_t tmp8u;
  uint8_t count;
  uint16_t width;
  uint16_t height;
  wchar_t x;
  wchar_t y;
  wchar_t n;
  wchar_t i;
  chunk *c1;
  chunk **c_local;
  
  c1 = (chunk *)c;
  rd_string(local_98,100);
  iVar1 = strcmp(local_98,"arena");
  if ((iVar1 == 0) && ((chunk_conflict *)c1->name == cave)) {
    player->upkeep->arena_level = true;
  }
  rd_u16b(&local_2a);
  rd_u16b(&local_2c);
  _n = (chunk *)cave_new((uint)local_2a,(uint)local_2c);
  pcVar2 = string_make(local_98);
  _n->name = pcVar2;
  for (x = L'\0'; x < (int)(uint)square_size; x = x + L'\x01') {
    _width = L'\0';
    _tmp16u = L'\0';
LAB_00185b10:
    if (_width < _n->height) {
      rd_byte((uint8_t *)(name + 99));
      rd_byte((uint8_t *)(name + 0x62));
      for (y = (wchar_t)(byte)name[99]; L'\0' < y; y = y + L'\xffffffff') {
        _n->squares[_width][_tmp16u].info[x] = name[0x62];
        _tmp16u = _tmp16u + L'\x01';
        if (_n->width <= _tmp16u) {
          _tmp16u = L'\0';
          _width = _width + L'\x01';
          if (_n->height <= _width) break;
        }
      }
      goto LAB_00185b10;
    }
  }
  _width = L'\0';
  _tmp16u = L'\0';
  do {
    if (_n->height <= _width) {
      rd_byte((uint8_t *)(name + 0x62));
      _n->feeling = name[0x62];
      rd_u16b((uint16_t *)(name + 0x60));
      _n->feeling_squares = name._96_2_;
      rd_s32b(&_n->turn);
      if (((player->opts).opt[0x2b] & 1U) != 0) {
        rd_byte((uint8_t *)(name + 0x62));
        while (name[0x62] != -1) {
          pcVar3 = (connector *)mem_zalloc(0x20);
          pbVar4 = (bitflag *)mem_zalloc((ulong)square_size);
          pcVar3->info = pbVar4;
          (pcVar3->grid).x = (uint)(byte)name[0x62];
          rd_byte((uint8_t *)(name + 0x62));
          (pcVar3->grid).y = (uint)(byte)name[0x62];
          rd_byte(&pcVar3->feat);
          for (x = L'\0'; x < (int)(uint)square_size; x = x + L'\x01') {
            rd_byte(pcVar3->info + x);
          }
          pcVar3->next = _n->join;
          _n->join = pcVar3;
          rd_byte((uint8_t *)(name + 0x62));
        }
      }
      c1->name = (char *)_n;
      return L'\0';
    }
    rd_byte((uint8_t *)(name + 99));
    rd_byte((uint8_t *)(name + 0x62));
    for (y = (wchar_t)(byte)name[99]; c_00 = _n, L'\0' < y; y = y + L'\xffffffff') {
      grid = (loc_conflict)loc(_tmp16u,_width);
      square_set_feat(c_00,grid,(uint)(byte)name[0x62]);
      _tmp16u = _tmp16u + L'\x01';
      if (_n->width <= _tmp16u) {
        _tmp16u = L'\0';
        _width = _width + L'\x01';
        if (_n->height <= _width) break;
      }
    }
  } while( true );
}

Assistant:

static int rd_dungeon_aux(struct chunk **c)
{
	struct chunk *c1;
	int i, n, y, x;

	uint16_t height, width;

	uint8_t count;
	uint8_t tmp8u;
	uint16_t tmp16u;
	char name[100];

	/* Header info */
	rd_string(name, sizeof(name));
	if (streq(name, "arena") && (*c == cave)) {
		player->upkeep->arena_level = true;
	}
	rd_u16b(&height);
	rd_u16b(&width);

	/* We need a cave struct */
	c1 = cave_new(height, width);
	c1->name = string_make(name);

    /* Run length decoding of cave->squares[y][x].info */
	for (n = 0; n < square_size; n++) {
		/* Load the dungeon data */
		for (x = y = 0; y < c1->height; ) {
			/* Grab RLE info */
			rd_byte(&count);
			rd_byte(&tmp8u);

			/* Apply the RLE info */
			for (i = count; i > 0; i--) {
				/* Extract "info" */
				c1->squares[y][x].info[n] = tmp8u;

				/* Advance/Wrap */
				if (++x >= c1->width) {
					/* Wrap */
					x = 0;

					/* Advance/Wrap */
					if (++y >= c1->height) break;
				}
			}
		}
	}

	/* Run length decoding of dungeon data */
	for (x = y = 0; y < c1->height; ) {
		/* Grab RLE info */
		rd_byte(&count);
		rd_byte(&tmp8u);

		/* Apply the RLE info */
		for (i = count; i > 0; i--) {
			/* Extract "feat" */
			square_set_feat(c1, loc(x, y), tmp8u);

			/* Advance/Wrap */
			if (++x >= c1->width) {
				/* Wrap */
				x = 0;

				/* Advance/Wrap */
				if (++y >= c1->height) break;
			}
		}
	}


	/* Read "feeling" */
	rd_byte(&tmp8u);
	c1->feeling = tmp8u;
	rd_u16b(&tmp16u);
	c1->feeling_squares = tmp16u;
	rd_s32b(&c1->turn);

	/* Read connector info */
	if (OPT(player, birth_levels_persist)) {
		rd_byte(&tmp8u);
		while (tmp8u != 0xff) {
			struct connector *current = mem_zalloc(sizeof *current);
			current->info = mem_zalloc(square_size * sizeof(bitflag));
			current->grid.x = tmp8u;
			rd_byte(&tmp8u);
			current->grid.y = tmp8u;
			rd_byte(&current->feat);
			for (n = 0; n < square_size; n++) {
				rd_byte(&current->info[n]);
			}
			current->next = c1->join;
			c1->join = current;
			rd_byte(&tmp8u);
		}
	}

	/* Assign */
	*c = c1;

	return 0;
}